

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

Vec_Wrd_t * Gia_ManDeriveSigns(Gia_Man_t *p,Vec_Int_t *vPivots,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  bool bVar8;
  Vec_Wrd_t *pVVar9;
  word *__s;
  ulong uVar10;
  word wVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  
  Gia_ManFillValue(p);
  iVar1 = vPivots->nSize;
  if (0 < (long)iVar1) {
    piVar6 = vPivots->pArray;
    lVar13 = 0;
    do {
      iVar15 = piVar6[lVar13];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_0070f7e0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar15].Value = (uint)lVar13;
      lVar13 = lVar13 + 1;
    } while (iVar1 != lVar13);
  }
  if (fVerbose != 0) {
    printf("Signature propagation: ");
  }
  iVar1 = p->nObjs;
  lVar13 = (long)iVar1;
  pVVar9 = (Vec_Wrd_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar15 = iVar1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar15;
  if (iVar15 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar15 << 3);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = iVar1;
  memset(__s,0,lVar13 * 8);
  do {
    uVar2 = p->nObjs;
    if ((0 < (int)uVar2) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar14 = &p->pObjs->Value;
      uVar16 = 0;
      do {
        uVar18 = *puVar14;
        if (uVar18 != 0xffffffff) {
          if (0x3f < uVar18) {
            __assert_fail("pObj->Value >= 0 && pObj->Value < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                          ,0x1bf,"Vec_Wrd_t *Gia_ManDeriveSigns(Gia_Man_t *, Vec_Int_t *, int)");
          }
          if (lVar13 <= (long)uVar16) goto LAB_0070f81e;
          __s[uVar16] = __s[uVar16] | 1L << ((byte)uVar18 & 0x3f);
        }
        uVar10 = *(ulong *)(puVar14 + -2);
        uVar18 = (uint)uVar10;
        if ((uVar10 & 0x1fffffff) == 0x1fffffff || (int)uVar18 < 0) {
          if ((int)uVar18 < 0 && (int)(uVar10 & 0x1fffffff) != 0x1fffffff) {
            uVar10 = -(uVar18 & 0x1fffffff) + uVar16;
            iVar15 = (int)uVar10;
            if ((-1 < iVar15) && (iVar15 < iVar1)) {
              if (lVar13 <= (long)uVar16) goto LAB_0070f81e;
              wVar11 = __s[uVar10 & 0xffffffff];
              goto LAB_0070f674;
            }
            goto LAB_0070f7c1;
          }
        }
        else {
          uVar17 = -(uVar18 & 0x1fffffff) + uVar16;
          iVar15 = (int)uVar17;
          if ((iVar15 < 0) || (iVar1 <= iVar15)) goto LAB_0070f7c1;
          uVar10 = -((uint)(uVar10 >> 0x20) & 0x1fffffff) + uVar16;
          iVar15 = (int)uVar10;
          if ((iVar15 < 0) || (iVar1 <= iVar15)) goto LAB_0070f7c1;
          if (lVar13 <= (long)uVar16) {
LAB_0070f81e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          wVar11 = __s[uVar10 & 0xffffffff] | __s[uVar17 & 0xffffffff];
LAB_0070f674:
          __s[uVar16] = __s[uVar16] | wVar11;
        }
        uVar16 = uVar16 + 1;
        puVar14 = puVar14 + 3;
      } while (uVar2 != uVar16);
    }
    iVar15 = p->nRegs;
    lVar12 = (long)iVar15;
    if (lVar12 < 1) {
      bVar8 = true;
    }
    else {
      pVVar7 = p->vCos;
      iVar3 = pVVar7->nSize;
      uVar16 = (ulong)(uint)(iVar3 - iVar15);
      iVar15 = -iVar15;
      bVar8 = false;
      do {
        if ((iVar3 + iVar15 < 0) || (iVar3 <= iVar3 + iVar15)) {
LAB_0070f7ff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = pVVar7->pArray[uVar16];
        if (((long)iVar4 < 0) || ((int)uVar2 <= iVar4)) goto LAB_0070f7e0;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        iVar5 = p->vCis->nSize;
        uVar18 = iVar15 + iVar5;
        if (((int)uVar18 < 0) || (iVar5 <= (int)uVar18)) goto LAB_0070f7ff;
        iVar5 = p->vCis->pArray[uVar18];
        lVar19 = (long)iVar5;
        if ((lVar19 < 0) || ((int)uVar2 <= iVar5)) goto LAB_0070f7e0;
        if ((iVar1 <= iVar5) || (iVar1 <= iVar4)) {
LAB_0070f7c1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        uVar10 = __s[lVar19];
        uVar17 = __s[iVar4] | uVar10;
        __s[lVar19] = uVar17;
        if (uVar10 != uVar17) {
          bVar8 = true;
        }
        iVar15 = iVar15 + 1;
        uVar16 = uVar16 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      bVar8 = !bVar8;
    }
    if (fVerbose != 0) {
      printf("%d ");
    }
    if (bVar8) {
      if (fVerbose != 0) {
        putchar(10);
      }
      return pVVar9;
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManDeriveSigns( Gia_Man_t * p, Vec_Int_t * vPivots, int fVerbose )
{
    Vec_Wrd_t * vSigns;
    Gia_Obj_t * pObj, * pObjRi;
    int i, fChange = 1, Counter;

    Gia_ManFillValue( p );
    Gia_ManForEachObjVec( vPivots, p, pObj, i )
        pObj->Value = i;

    if ( fVerbose )
        printf( "Signature propagation: " );
    vSigns = Vec_WrdStart( Gia_ManObjNum(p) );
    while ( fChange )
    {
        fChange = 0;
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( ~pObj->Value )
            {
                assert( pObj->Value >= 0 && pObj->Value < 64 );
                *Vec_WrdEntryP( vSigns, i ) |= ( (word)1 << pObj->Value );
            }
            if ( Gia_ObjIsAnd(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i)) | Vec_WrdEntry(vSigns, Gia_ObjFaninId1(pObj, i));
            else if ( Gia_ObjIsCo(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i));
        }
        Counter = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObj, i )
        {
            word Value = Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj));
            *Vec_WrdEntryP( vSigns, Gia_ObjId(p, pObj) ) |= Vec_WrdEntry(vSigns, Gia_ObjId(p, pObjRi));
            if ( Value != Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj)) )
                fChange = 1, Counter++;
        }
        if ( fVerbose )
            printf( "%d ", Counter );
    }
    if ( fVerbose )
       printf( "\n" );
    return vSigns;
}